

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigrecord_r.hh
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
testgen_r::_bigrecord_r_Union__3__::get_bytes
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          _bigrecord_r_Union__3__ *this)

{
  Exception *this_00;
  any *in_RDX;
  allocator<char> local_39;
  string local_38;
  
  if (this->idx_ == 0) {
    boost::any_cast<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              (__return_storage_ptr__,(boost *)&this->value_,in_RDX);
    return __return_storage_ptr__;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Invalid type for union",&local_39);
  avro::Exception::Exception(this_00,&local_38);
  __cxa_throw(this_00,&avro::Exception::typeinfo,avro::Exception::~Exception);
}

Assistant:

inline
std::vector<uint8_t> _bigrecord_r_Union__3__::get_bytes() const {
    if (idx_ != 0) {
        throw avro::Exception("Invalid type for union");
    }
    return boost::any_cast<std::vector<uint8_t> >(value_);
}